

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool Intersect(VmInstruction *a,VmInstruction *b)

{
  bool bVar1;
  VmInstruction *local_20;
  VmInstruction *b_local;
  VmInstruction *a_local;
  
  if (a == b) {
    a_local._7_1_ = true;
  }
  else {
    local_20 = b;
    if (b->cmd == VM_INST_DEF) {
      for (; local_20->cmd != VM_INST_PARALLEL_COPY; local_20 = local_20->nextSibling) {
      }
    }
    bVar1 = IsLiveAt(a,local_20->nextSibling);
    if (bVar1) {
      a_local._7_1_ = true;
    }
    else {
      bVar1 = IsLiveAt(local_20,a->nextSibling);
      if (bVar1) {
        a_local._7_1_ = true;
      }
      else {
        a_local._7_1_ = false;
      }
    }
  }
  return a_local._7_1_;
}

Assistant:

bool Intersect(VmInstruction *a, VmInstruction *b)
{
	// Same definition
	if(a == b)
		return true;

	// 'def' pseudo-instruction definition locations is at following parallel copy instruction
	if(b->cmd == VM_INST_DEF)
	{
		while(b->cmd != VM_INST_PARALLEL_COPY)
			b = b->nextSibling;
	}

	// a dominates b and a is live just after the definition of b
	if(IsLiveAt(a, b->nextSibling))
		return true;

	// b dominates a and b is live just after the definition of a
	if(IsLiveAt(b, a->nextSibling))
		return true;

	return false;
}